

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O0

void __thiscall libcellml::Model::Model(Model *this,string *name)

{
  ModelImpl *this_00;
  string *name_local;
  Model *this_local;
  
  this_00 = (ModelImpl *)operator_new(0xa0);
  (this_00->mUnits).
  super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->mUnits).
  super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)((long)&(this_00->super_ComponentEntityImpl).mEncapsulationId.field_2 + 8) = 0;
  (this_00->mUnits).
  super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->super_ComponentEntityImpl).mEncapsulationId._M_string_length = 0;
  (this_00->super_ComponentEntityImpl).mEncapsulationId.field_2._M_allocated_capacity = 0;
  (this_00->super_ComponentEntityImpl).mComponents.
  super__Vector_base<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)&(this_00->super_ComponentEntityImpl).mEncapsulationId = 0;
  (this_00->super_ComponentEntityImpl).mComponents.
  super__Vector_base<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->super_ComponentEntityImpl).mComponents.
  super__Vector_base<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->super_ComponentEntityImpl).super_NamedEntityImpl.mName.field_2._M_allocated_capacity = 0
  ;
  *(undefined8 *)
   ((long)&(this_00->super_ComponentEntityImpl).super_NamedEntityImpl.mName.field_2 + 8) = 0;
  *(undefined8 *)&(this_00->super_ComponentEntityImpl).super_NamedEntityImpl.mName = 0;
  (this_00->super_ComponentEntityImpl).super_NamedEntityImpl.mName._M_string_length = 0;
  (this_00->super_ComponentEntityImpl).super_NamedEntityImpl.super_ParentedEntityImpl.mParent.
  super___weak_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this_00->super_ComponentEntityImpl).super_NamedEntityImpl.super_ParentedEntityImpl.mParent.
  super___weak_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this_00->super_ComponentEntityImpl).super_NamedEntityImpl.super_ParentedEntityImpl.
  super_EntityImpl.mId.field_2._M_allocated_capacity = 0;
  *(undefined8 *)
   ((long)&(this_00->super_ComponentEntityImpl).super_NamedEntityImpl.super_ParentedEntityImpl.
           super_EntityImpl.mId.field_2 + 8) = 0;
  *(undefined8 *)
   &(this_00->super_ComponentEntityImpl).super_NamedEntityImpl.super_ParentedEntityImpl.
    super_EntityImpl.mId = 0;
  (this_00->super_ComponentEntityImpl).super_NamedEntityImpl.super_ParentedEntityImpl.
  super_EntityImpl.mId._M_string_length = 0;
  ModelImpl::ModelImpl(this_00);
  ComponentEntity::ComponentEntity(&this->super_ComponentEntity,(ComponentEntityImpl *)this_00);
  std::enable_shared_from_this<libcellml::Model>::enable_shared_from_this
            (&this->super_enable_shared_from_this<libcellml::Model>);
  (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity =
       (_func_int **)&PTR__Model_0046a030;
  NamedEntity::setName((NamedEntity *)this,name);
  return;
}

Assistant:

Model::Model(const std::string &name)
    : ComponentEntity(new Model::ModelImpl())
{
    setName(name);
}